

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O1

PixelValue vkt::anon_unknown_0::clearValueToPixelValue(VkClearValue *value,TextureFormat *format)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  TextureChannelClass TVar5;
  Maybe<bool> *pMVar6;
  long lVar7;
  uint uVar8;
  BVec4 channelMask;
  PixelValue local_6a;
  Maybe<bool> local_68;
  Maybe<bool> local_58;
  Maybe<bool> local_48;
  Maybe<bool> local_38;
  
  bVar3 = tcu::hasDepthComponent(format->order);
  bVar4 = tcu::hasStencilComponent(format->order);
  local_68.m_ptr = (bool *)0x0;
  local_38.m_ptr = (bool *)0x0;
  local_48.m_ptr = (bool *)0x0;
  local_58.m_ptr = (bool *)0x0;
  PixelValue::PixelValue(&local_6a,&local_68,&local_38,&local_48,&local_58);
  if (bVar3 || bVar4) {
    if (bVar3) {
      fVar1 = (value->depthStencil).depth;
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          local_6a.m_status = (local_6a.m_status & 0xfffc) + 1;
        }
      }
      else {
        local_6a.m_status = local_6a.m_status | 3;
      }
    }
    if (bVar4) {
      if ((value->depthStencil).stencil == 0) {
        local_6a.m_status = local_6a.m_status & 0xfff3 | 4;
      }
      else if ((value->depthStencil).stencil == 0xff) {
        local_6a.m_status = local_6a.m_status | 0xc;
      }
    }
  }
  else {
    TVar5 = tcu::getTextureChannelClass(format->type);
    pMVar6 = &local_68;
    tcu::getTextureFormatChannelMask((tcu *)pMVar6,format);
    switch(TVar5) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      pMVar6 = &local_68;
      uVar8 = (uint)local_6a.m_status;
      lVar7 = 0;
      do {
        if (*(char *)&pMVar6->m_ptr == '\x01') {
          fVar1 = *(float *)((long)value + lVar7 * 2);
          if ((fVar1 != 1.0) || (NAN(fVar1))) {
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              uVar8 = ~(2 << ((byte)lVar7 & 0x1f)) & (uVar8 | 1 << ((uint)lVar7 & 0x1f));
            }
          }
          else {
            uVar8 = uVar8 | 3 << ((byte)lVar7 & 0x1f);
          }
        }
        local_6a.m_status = (deUint16)uVar8;
        lVar7 = lVar7 + 2;
        pMVar6 = (Maybe<bool> *)((long)&pMVar6->m_ptr + 1);
      } while (lVar7 != 8);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      pMVar6 = &local_68;
      uVar8 = (uint)local_6a.m_status;
      lVar7 = 0;
      do {
        if (*(char *)&pMVar6->m_ptr == '\x01') {
          iVar2 = *(int *)((long)value + lVar7 * 2);
          if (iVar2 == 0) {
            uVar8 = ~(2 << ((byte)lVar7 & 0x1f)) & (uVar8 | 1 << ((uint)lVar7 & 0x1f));
          }
          else if (iVar2 == 1) {
            uVar8 = uVar8 | 3 << ((byte)lVar7 & 0x1f);
          }
        }
        local_6a.m_status = (deUint16)uVar8;
        lVar7 = lVar7 + 2;
        pMVar6 = (Maybe<bool> *)((long)&pMVar6->m_ptr + 1);
      } while (lVar7 != 8);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      uVar8 = (uint)local_6a.m_status;
      lVar7 = 0;
      do {
        if (*(char *)&pMVar6->m_ptr == '\x01') {
          iVar2 = *(int *)((long)value + lVar7 * 2);
          if (iVar2 == 0) {
            uVar8 = ~(2 << ((byte)lVar7 & 0x1f)) & (uVar8 | 1 << ((uint)lVar7 & 0x1f));
          }
          else if (iVar2 == 1) {
            uVar8 = uVar8 | 3 << ((byte)lVar7 & 0x1f);
          }
        }
        local_6a.m_status = (deUint16)uVar8;
        lVar7 = lVar7 + 2;
        pMVar6 = (Maybe<bool> *)((long)&pMVar6->m_ptr + 1);
      } while (lVar7 != 8);
    }
  }
  return (PixelValue)local_6a.m_status;
}

Assistant:

PixelValue clearValueToPixelValue (const VkClearValue&			value,
								   const tcu::TextureFormat&	format)
{
	const bool	isDepthAttachment			= hasDepthComponent(format.order);
	const bool	isStencilAttachment			= hasStencilComponent(format.order);
	const bool	isDepthOrStencilAttachment	= isDepthAttachment || isStencilAttachment;
	PixelValue	pixelValue;

	if (isDepthOrStencilAttachment)
	{
		if (isDepthAttachment)
		{
			if (value.depthStencil.depth == 1.0f)
				pixelValue.setValue(0, true);
			else if (value.depthStencil.depth == 0.0f)
				pixelValue.setValue(0, false);
			else
				DE_FATAL("Unknown depth value");
		}

		if (isStencilAttachment)
		{
			if (value.depthStencil.stencil == 0xFFu)
				pixelValue.setValue(1, true);
			else if (value.depthStencil.stencil == 0x0u)
				pixelValue.setValue(1, false);
			else
				DE_FATAL("Unknown stencil value");
		}
	}
	else
	{
		const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);
		const tcu::BVec4				channelMask		= tcu::getTextureFormatChannelMask(format);

		switch (channelClass)
		{
			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.int32[i] == 1)
							pixelValue.setValue(i, true);
						else if (value.color.int32[i] == 0)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.uint32[i] == 1u)
							pixelValue.setValue(i, true);
						else if (value.color.uint32[i] == 0u)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.float32[i] == 1.0f)
							pixelValue.setValue(i, true);
						else if (value.color.float32[i] == 0.0f)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			default:
				DE_FATAL("Unknown channel class");
		}
	}

	return pixelValue;
}